

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

any * __thiscall type::any::operator=(any *this,double *value)

{
  _func_int **pp_Var1;
  erasure *peVar2;
  
  if (this->_value != (erasure *)0x0) {
    (*this->_value->_vptr_erasure[1])();
  }
  peVar2 = (erasure *)operator_new(0x10);
  pp_Var1 = (_func_int **)*value;
  peVar2->_vptr_erasure = (_func_int **)&PTR__erasure_00103d70;
  peVar2[1]._vptr_erasure = pp_Var1;
  this->_value = peVar2;
  return this;
}

Assistant:

any& operator=(T const& value) {
        if(_value) {
          delete _value;
        }

        _value = new erasure_impl<typename std::decay<T const&>::type>(value);
        return *this;
      }